

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O2

int SHA512_Final(uchar *md,SHA512_CTX *c)

{
  ulonglong uVar1;
  undefined8 uVar2;
  ulonglong uVar3;
  int j;
  long in_RAX;
  
  if (c != (SHA512_CTX *)0x0) {
    if (md != (uchar *)0x0) {
      SHA512_Last((SHA512_CTX *)c);
      for (in_RAX = 0; in_RAX != 8; in_RAX = in_RAX + 1) {
        uVar3 = c->h[in_RAX];
        uVar1 = swap_bytes(uVar3);
        c->h[in_RAX] = uVar1;
        uVar2 = swap_bytes(uVar3);
        *(undefined8 *)(md + in_RAX * 8) = uVar2;
      }
    }
    (c->u).d[8] = 0;
    (c->u).d[9] = 0;
    (c->u).d[10] = 0;
    (c->u).d[0xb] = 0;
    (c->u).d[0xc] = 0;
    (c->u).d[0xd] = 0;
    (c->u).d[0xe] = 0;
    (c->u).d[0xf] = 0;
    (c->u).d[6] = 0;
    (c->u).d[7] = 0;
    (c->u).d[8] = 0;
    (c->u).d[9] = 0;
    (c->u).d[10] = 0;
    (c->u).d[0xb] = 0;
    (c->u).d[0xc] = 0;
    (c->u).d[0xd] = 0;
    c->Nl = 0;
    c->Nh = 0;
    (c->u).d[0] = 0;
    (c->u).d[1] = 0;
    (c->u).d[2] = 0;
    (c->u).d[3] = 0;
    (c->u).d[4] = 0;
    (c->u).d[5] = 0;
    c->h[0] = 0;
    c->h[1] = 0;
    c->h[2] = 0;
    c->h[3] = 0;
    c->h[4] = 0;
    c->h[5] = 0;
    c->h[6] = 0;
    c->h[7] = 0;
    return (int)in_RAX;
  }
  __assert_fail("context != (SHA512_CTX*)0",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                0x39b,"void SHA512_Final(sha2_byte *, SHA512_CTX *)");
}

Assistant:

void SHA512_Final(sha2_byte digest[SHA512_DIGEST_LENGTH], SHA512_CTX* context) {
	sha2_word64	*d = (sha2_word64*)digest;

	/* Sanity check: */
	assert(context != (SHA512_CTX*)0);

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		SHA512_Last(context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		{
			/* Convert TO host byte order */
			int	j;
			for (j = 0; j < 8; j++) {
				REVERSE64(context->state[j],context->state[j]);
				*d++ = context->state[j];
			}
		}
#else
		MEMCPY_BCOPY(d, context->state, SHA512_DIGEST_LENGTH);
#endif
	}

	/* Zero out state data */
	MEMSET_BZERO(context, sizeof(SHA512_CTX));
}